

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O2

void __thiscall
ConsoleTable::ConsoleTable
          (ConsoleTable *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          headers)

{
  string *psVar1;
  RowType *pRVar2;
  RowType *this_00;
  const_iterator __begin1;
  iterator pbVar3;
  long lVar4;
  allocator local_7a;
  allocator local_79;
  allocator local_78;
  allocator local_77;
  allocator local_76;
  allocator local_75;
  allocator local_74;
  allocator local_73;
  allocator local_72;
  allocator local_71;
  TableStyle *local_70;
  TableStyle *local_68;
  size_type local_60;
  TableStyle *local_58;
  RowType *local_50;
  TableStyle *local_48;
  TableStyle *local_40;
  RowType *local_38;
  
  pbVar3 = headers._M_array;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->headers,headers,(allocator_type *)&local_60);
  local_40 = &this->BasicStyle;
  (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)local_40,"-",(allocator *)&local_60);
  psVar1 = &(this->BasicStyle).vertical;
  std::__cxx11::string::string((string *)psVar1,"|",&local_71);
  pRVar2 = &(this->BasicStyle).top;
  local_48 = (TableStyle *)psVar1;
  std::__cxx11::string::string((string *)pRVar2,"+",&local_72);
  std::__cxx11::string::string((string *)&(this->BasicStyle).top.intersect,"+",&local_73);
  std::__cxx11::string::string((string *)&(this->BasicStyle).top.right,"+",&local_74);
  this_00 = &(this->BasicStyle).middle;
  local_58 = (TableStyle *)pRVar2;
  std::__cxx11::string::string((string *)this_00,"+",&local_75);
  std::__cxx11::string::string((string *)&(this->BasicStyle).middle.intersect,"+",&local_76);
  std::__cxx11::string::string((string *)&(this->BasicStyle).middle.right,"+",&local_77);
  local_70 = (TableStyle *)this_00;
  std::__cxx11::string::string((string *)&(this->BasicStyle).bottom,"+",&local_78);
  std::__cxx11::string::string((string *)&(this->BasicStyle).bottom.intersect,"+",&local_79);
  std::__cxx11::string::string((string *)&(this->BasicStyle).bottom.right,"+",&local_7a);
  std::__cxx11::string::string
            ((string *)&this->LineStyle,anon_var_dwarf_b237,(allocator *)&local_60);
  psVar1 = &(this->LineStyle).vertical;
  local_48 = &this->LineStyle;
  std::__cxx11::string::string((string *)psVar1,anon_var_dwarf_b24e,&local_71);
  local_70 = (TableStyle *)&(this->LineStyle).top;
  local_58 = (TableStyle *)psVar1;
  std::__cxx11::string::string((string *)local_70,anon_var_dwarf_b258,&local_72);
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).top.intersect,anon_var_dwarf_b262,&local_73);
  std::__cxx11::string::string((string *)&(this->LineStyle).top.right,anon_var_dwarf_b26c,&local_74)
  ;
  pRVar2 = &(this->LineStyle).middle;
  std::__cxx11::string::string((string *)pRVar2,anon_var_dwarf_b276,&local_75);
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).middle.intersect,anon_var_dwarf_b280,&local_76);
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).middle.right,anon_var_dwarf_b28a,&local_77);
  local_68 = (TableStyle *)pRVar2;
  std::__cxx11::string::string((string *)&(this->LineStyle).bottom,anon_var_dwarf_b294,&local_78);
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).bottom.intersect,anon_var_dwarf_b29e,&local_79);
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).bottom.right,anon_var_dwarf_b2a8,&local_7a);
  std::__cxx11::string::string
            ((string *)&this->DoubleLineStyle,anon_var_dwarf_b2b2,(allocator *)&local_60);
  psVar1 = &(this->DoubleLineStyle).vertical;
  local_58 = &this->DoubleLineStyle;
  std::__cxx11::string::string((string *)psVar1,anon_var_dwarf_b2bc,&local_71);
  local_68 = (TableStyle *)&(this->DoubleLineStyle).top;
  local_70 = (TableStyle *)psVar1;
  std::__cxx11::string::string((string *)local_68,anon_var_dwarf_b2c6,&local_72);
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).top.intersect,anon_var_dwarf_b2d0,&local_73);
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).top.right,anon_var_dwarf_b2da,&local_74);
  pRVar2 = &(this->DoubleLineStyle).middle;
  std::__cxx11::string::string((string *)pRVar2,anon_var_dwarf_b2e4,&local_75);
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).middle.intersect,anon_var_dwarf_b2ee,&local_76);
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).middle.right,anon_var_dwarf_b2f8,&local_77);
  local_50 = pRVar2;
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).bottom,anon_var_dwarf_b302,&local_78);
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).bottom.intersect,anon_var_dwarf_b30c,&local_79);
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).bottom.right,anon_var_dwarf_b316,&local_7a);
  std::__cxx11::string::string((string *)&this->InvisibleStyle," ",(allocator *)&local_60);
  psVar1 = &(this->InvisibleStyle).vertical;
  local_70 = &this->InvisibleStyle;
  std::__cxx11::string::string((string *)psVar1," ",&local_71);
  local_50 = &(this->InvisibleStyle).top;
  local_68 = (TableStyle *)psVar1;
  std::__cxx11::string::string((string *)local_50," ",&local_72);
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).top.intersect," ",&local_73);
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).top.right," ",&local_74);
  local_38 = &(this->InvisibleStyle).middle;
  std::__cxx11::string::string((string *)local_38," ",&local_75);
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).middle.intersect," ",&local_76);
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).middle.right," ",&local_77);
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).bottom," ",&local_78);
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).bottom.intersect," ",&local_79);
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).bottom.right," ",&local_7a);
  TableStyle::TableStyle(&this->style,local_40);
  local_68 = &this->style;
  std::__cxx11::string::string((string *)&this->SPACE_CHARACTER," ",(allocator *)&local_60);
  this->padding = 1;
  for (lVar4 = headers._M_len << 5; lVar4 != 0; lVar4 = lVar4 + -0x20) {
    local_60 = pbVar3->_M_string_length;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->widths,&local_60);
    pbVar3 = pbVar3 + 1;
  }
  return;
}

Assistant:

ConsoleTable::ConsoleTable(std::initializer_list<std::string> headers) : headers{headers} {
    for (const auto &column : headers) {
        widths.push_back(column.length());
    }
}